

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

ImDrawCmd * __thiscall
ImVector<ImDrawCmd>::insert(ImVector<ImDrawCmd> *this,ImDrawCmd *it,ImDrawCmd *v)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  ImDrawCmd *pIVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ImTextureID pvVar8;
  undefined8 uVar9;
  ImDrawCallback p_Var10;
  ImDrawCmd *pIVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  
  pIVar11 = this->Data;
  if ((pIVar11 <= it) && (iVar3 = this->Size, it <= pIVar11 + iVar3)) {
    lVar14 = (long)it - (long)pIVar11;
    iVar4 = this->Capacity;
    if (iVar3 == iVar4) {
      if (iVar4 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar4 / 2 + iVar4;
      }
      iVar15 = iVar3 + 1;
      if (iVar3 + 1 < iVar13) {
        iVar15 = iVar13;
      }
      if (iVar4 < iVar15) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar11 = (ImDrawCmd *)(*GImAllocatorAllocFunc)((long)iVar15 * 0x38,GImAllocatorUserData);
        if (this->Data != (ImDrawCmd *)0x0) {
          memcpy(pIVar11,this->Data,(long)this->Size * 0x38);
          pIVar5 = this->Data;
          if ((pIVar5 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
        }
        this->Data = pIVar11;
        this->Capacity = iVar15;
      }
    }
    lVar12 = (long)this->Size + (lVar14 >> 3) * -0x6db6db6db6db6db7;
    if (lVar12 != 0 && (lVar14 >> 3) * 0x6db6db6db6db6db7 <= (long)this->Size) {
      memmove((void *)((long)this->Data + lVar14 + 0x38),(void *)((long)this->Data + lVar14),
              lVar12 * 0x38);
    }
    pIVar11 = this->Data;
    *(void **)((long)pIVar11 + lVar14 + 0x30) = v->UserCallbackData;
    uVar6 = *(undefined8 *)&v->ClipRect;
    uVar7 = *(undefined8 *)&(v->ClipRect).z;
    pvVar8 = v->TextureId;
    uVar9 = *(undefined8 *)&v->VtxOffset;
    p_Var10 = v->UserCallback;
    puVar2 = (undefined8 *)((long)pIVar11 + lVar14 + 0x20);
    *puVar2 = *(undefined8 *)&v->ElemCount;
    puVar2[1] = p_Var10;
    puVar2 = (undefined8 *)((long)pIVar11 + lVar14 + 0x10);
    *puVar2 = pvVar8;
    puVar2[1] = uVar9;
    *(undefined8 *)((long)pIVar11 + lVar14) = uVar6;
    ((undefined8 *)((long)pIVar11 + lVar14))[1] = uVar7;
    this->Size = this->Size + 1;
    return (ImDrawCmd *)(lVar14 + (long)this->Data);
  }
  __assert_fail("it >= Data && it <= Data + Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                ,0x71e,"T *ImVector<ImDrawCmd>::insert(const T *, const T &) [T = ImDrawCmd]");
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }